

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_suppressor.cc
# Opt level: O0

void __thiscall
webrtc::TransientSuppressor::UpdateKeypress(TransientSuppressor *this,bool key_pressed)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  LogMessage local_348;
  LogMessageVoidify local_1c5 [20];
  byte local_1b1;
  LogMessage local_1b0;
  LogMessageVoidify local_29;
  int local_28 [4];
  int kChunksUntilNotTyping;
  int kIsTypingThreshold;
  int kKeypressPenalty;
  bool key_pressed_local;
  TransientSuppressor *this_local;
  
  kChunksUntilNotTyping = 100;
  local_28[3] = 100;
  local_28[2] = 400;
  if (key_pressed) {
    this->keypress_counter_ = this->keypress_counter_ + 100;
    this->chunks_since_keypress_ = 0;
    this->detection_enabled_ = true;
  }
  local_28[1] = 0;
  local_28[0] = this->keypress_counter_ + -1;
  kIsTypingThreshold._3_1_ = key_pressed;
  _kKeypressPenalty = this;
  piVar3 = std::max<int>(local_28 + 1,local_28);
  this->keypress_counter_ = *piVar3;
  if (100 < this->keypress_counter_) {
    if ((this->suppression_enabled_ & 1U) == 0) {
      bVar1 = LogMessage::Loggable(LS_INFO);
      local_1b1 = 0;
      if (bVar1) {
        LogMessageVoidify::LogMessageVoidify(&local_29);
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                   ,0x12a,LS_INFO);
        local_1b1 = 1;
        poVar4 = LogMessage::stream(&local_1b0);
        poVar4 = std::operator<<(poVar4,"[ts] Transient suppression is now enabled.");
        LogMessageVoidify::operator&(&local_29,poVar4);
      }
      if ((local_1b1 & 1) != 0) {
        LogMessage::~LogMessage(&local_1b0);
      }
    }
    this->suppression_enabled_ = true;
    this->keypress_counter_ = 0;
  }
  if (((this->detection_enabled_ & 1U) != 0) &&
     (iVar2 = this->chunks_since_keypress_ + 1, this->chunks_since_keypress_ = iVar2, 400 < iVar2))
  {
    if (((this->suppression_enabled_ & 1U) != 0) && (bVar1 = LogMessage::Loggable(LS_INFO), bVar1))
    {
      LogMessageVoidify::LogMessageVoidify(local_1c5);
      LogMessage::LogMessage
                (&local_348,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                 ,0x133,LS_INFO);
      poVar4 = LogMessage::stream(&local_348);
      poVar4 = std::operator<<(poVar4,"[ts] Transient suppression is now disabled.");
      LogMessageVoidify::operator&(local_1c5,poVar4);
      LogMessage::~LogMessage(&local_348);
    }
    this->detection_enabled_ = false;
    this->suppression_enabled_ = false;
    this->keypress_counter_ = 0;
  }
  return;
}

Assistant:

void TransientSuppressor::UpdateKeypress(bool key_pressed) {
  const int kKeypressPenalty = 1000 / ts::kChunkSizeMs;
  const int kIsTypingThreshold = 1000 / ts::kChunkSizeMs;
  const int kChunksUntilNotTyping = 4000 / ts::kChunkSizeMs;  // 4 seconds.

  if (key_pressed) {
    keypress_counter_ += kKeypressPenalty;
    chunks_since_keypress_ = 0;
    detection_enabled_ = true;
  }
  keypress_counter_ = std::max(0, keypress_counter_ - 1);

  if (keypress_counter_ > kIsTypingThreshold) {
    if (!suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now enabled.";
    }
    suppression_enabled_ = true;
    keypress_counter_ = 0;
  }

  if (detection_enabled_ &&
      ++chunks_since_keypress_ > kChunksUntilNotTyping) {
    if (suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now disabled.";
    }
    detection_enabled_ = false;
    suppression_enabled_ = false;
    keypress_counter_ = 0;
  }
}